

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O2

map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
* __thiscall
adios2::core::engine::InlineReader::DoAllStepsBlocksInfo
          (map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
           *__return_storage_ptr__,InlineReader *this,Variable<unsigned_long> *variable)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  ScopedTimer __var2196;
  ScopedTimer SStack_18;
  
  if (DoAllStepsBlocksInfo(adios2::core::Variable<unsigned_long>const&)::__var196 == '\0') {
    iVar2 = __cxa_guard_acquire(&DoAllStepsBlocksInfo(adios2::core::Variable<unsigned_long>const&)::
                                 __var196);
    if (iVar2 != 0) {
      DoAllStepsBlocksInfo::__var196 = (void *)ps_timer_create_("InlineReader::AllStepsBlockInfo");
      __cxa_guard_release(&DoAllStepsBlocksInfo(adios2::core::Variable<unsigned_long>const&)::
                           __var196);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&SStack_18,DoAllStepsBlocksInfo::__var196);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&SStack_18);
  return __return_storage_ptr__;
}

Assistant:

void InlineReader::Init()
{
    InitParameters();
    InitTransports();
}